

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void ppu_mode3_synchronize(Emulator *e)

{
  ColorPalettes *pCVar1;
  byte bVar2;
  u8 uVar3;
  TileDataSelect TVar4;
  ObjSize OVar5;
  int iVar6;
  long lVar7;
  char cVar8;
  char cVar9;
  byte bVar10;
  RGBA RVar11;
  uint uVar12;
  ColorPalettes *pCVar13;
  ulong uVar14;
  byte bVar15;
  ushort uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  PaletteRGBA *pPVar28;
  byte bVar29;
  byte bVar30;
  RGBA *pRVar31;
  byte bVar32;
  PaletteRGBA *pPVar33;
  bool bVar34;
  bool bVar35;
  Bool bg_priority [4];
  char local_ce;
  uint local_c8;
  uint local_c4;
  uint local_68 [8];
  Ticks local_48;
  ulong local_40;
  ColorPalettes *local_38;
  Bool bg_is_zero [4];
  
  bVar32 = (e->state).ppu.render_x;
  if (bVar32 < 0xa0 && (e->state).ppu.stat.mode == PPU_MODE_MODE3) {
    if (((e->state).is_cgb == FALSE) && ((e->state).ppu.lcdc.bg_display == FALSE)) {
      bVar34 = false;
    }
    else {
      bVar34 = (e->config).disable_bg == FALSE;
    }
    iVar6 = 0;
    if ((e->state).ppu.lcdc.obj_display == FALSE) {
      bVar35 = false;
    }
    else {
      bVar35 = (e->config).disable_obj == FALSE;
    }
    bVar2 = (e->state).ppu.line_y;
    if (((((e->state).ppu.rendering_window == FALSE) &&
         (iVar6 = 0xff, (e->state).ppu.lcdc.window_display != FALSE)) &&
        ((e->config).disable_window == FALSE)) &&
       ((uVar23 = (uint)(e->state).ppu.wx, uVar23 < 0xa7 && ((e->state).ppu.wy <= bVar2)))) {
      iVar19 = uVar23 - bVar32;
      iVar6 = 7;
      if (7 < iVar19) {
        iVar6 = iVar19;
      }
      iVar6 = iVar6 + -7;
    }
    TVar4 = (e->state).ppu.lcdc.bg_tile_data_select;
    bVar29 = (e->state).ppu.scx + bVar32;
    bVar20 = (e->state).ppu.scy + bVar2;
    local_c8 = (uint)bVar20;
    local_c4 = (uint)((e->state).ppu.lcdc.bg_tile_map_select != TILE_MAP_9800_9BFF) * 0x400 +
               (uint)(bVar20 >> 3) * 0x20 + 0x1800;
    pRVar31 = ppu_mode3_synchronize::s_dummy_frame_buffer_line;
    if ((e->state).sgb.mask == SGB_MASK_CANCEL) {
      pRVar31 = e->frame_buffer + ((uint)bVar2 * 0xa0 + (uint)bVar32);
    }
    local_48 = (e->state).ticks;
    local_40 = (e->state).ppu.mode3_render_ticks;
    pCVar1 = &(e->state).ppu.bgcp;
    local_38 = &(e->state).ppu.obcp;
    local_ce = -bVar32;
    cVar8 = bVar32 + 7;
    iVar6 = -iVar6;
    uVar27 = 0;
    bVar21 = 0;
    bVar20 = 0;
    pPVar28 = (PaletteRGBA *)0x0;
    uVar23 = 0;
    for (; (local_40 < local_48 && (bVar32 < 0xa0)); bVar32 = bVar32 + 4) {
      local_68[0] = 1;
      local_68[1] = 1;
      local_68[2] = 1;
      local_68[3] = 1;
      local_68[4] = 0;
      local_68[5] = 0;
      local_68[6] = 0;
      local_68[7] = 0;
      for (lVar7 = -4; lVar7 != 0; lVar7 = lVar7 + 1) {
        if (iVar6 + (int)lVar7 == -4) {
          (e->state).ppu.rendering_window = TRUE;
          uVar23 = 0;
          local_c8 = (uint)(e->state).ppu.win_y;
          local_c4 = (uint)((e->state).ppu.lcdc.window_tile_map_select != TILE_MAP_9800_9BFF) *
                     0x400 + (local_c8 & 0xf8) * 4 + 0x1800;
          bVar29 = ((cVar8 + (char)lVar7) - (e->state).ppu.wx) + 4;
          bVar34 = true;
LAB_0010c4de:
          uVar17 = bVar29 >> 3 | local_c4;
          if ((short)uVar23 == (short)uVar17) {
            bVar20 = bVar20 * '\x02';
            bVar21 = bVar21 * '\x02';
          }
          else {
            uVar25 = (ulong)(bVar29 >> 3 | local_c4);
            bVar20 = (e->state).vram.data[uVar25];
            bVar21 = (byte)local_c8 & 7;
            uVar16 = (ushort)bVar20;
            if (TVar4 == TILE_DATA_8800_97FF) {
              uVar16 = (short)(char)bVar20 + 0x100;
            }
            if ((e->state).is_cgb == FALSE) {
              pPVar28 = e->pal;
              if ((e->state).is_sgb != FALSE) {
                pPVar28 = (PaletteRGBA *)
                          ((long)e->sgb_pal[0].color +
                          (ulong)(((e->state).sgb.attr_map
                                   [(uint)(bVar32 >> 3) + (uint)(bVar2 >> 3) * 0x14 >> 2] >>
                                   (~(bVar32 >> 2) & 6) & 3) << 4));
              }
              uVar25 = (ulong)(ushort)((short)((int)(short)uVar16 << 4) + (ushort)bVar21 * 2);
              bVar20 = (e->state).vram.data[uVar25];
              bVar21 = (e->state).vram.data[uVar25 + 1];
              bVar22 = 0;
            }
            else {
              bVar10 = (e->state).vram.data[uVar25 + 0x2000];
              pPVar28 = (PaletteRGBA *)
                        ((long)pCVar1->palettes[0].color + (ulong)((bVar10 & 7) << 4));
              bVar22 = bVar10 >> 7;
              bVar21 = bVar21 * '\x02';
              bVar20 = bVar21 ^ 0xe;
              if ((bVar10 & 0x40) == 0) {
                bVar20 = bVar21;
              }
              uVar25 = (ulong)((uint)bVar20 | (short)uVar16 * 0x10 + (bVar10 & 8) * 0x400 & 0xffff);
              bVar20 = (e->state).vram.data[uVar25];
              bVar21 = (e->state).vram.data[uVar25 + 1];
              if ((bVar10 & 0x20) != 0) {
                bVar20 = bVar20 << 4 | bVar20 >> 4;
                bVar20 = bVar20 >> 2 & 0x33 | (bVar20 & 0x33) << 2;
                bVar20 = bVar20 >> 1 & 0x55 | (bVar20 & 0x55) * '\x02';
                bVar21 = bVar21 << 4 | bVar21 >> 4;
                bVar21 = bVar21 >> 2 & 0x33 | (bVar21 & 0x33) << 2;
                bVar21 = bVar21 >> 1 & 0x55 | (bVar21 & 0x55) * '\x02';
              }
            }
            uVar27 = (uint)bVar22;
            bVar20 = bVar20 << (bVar29 & 7);
            bVar21 = bVar21 << (bVar29 & 7);
            uVar23 = uVar17;
          }
          bVar22 = bVar20 >> 7 | bVar21 >> 6 & 2;
          pRVar31[lVar7 + 4] = pPVar28->color[bVar22];
          local_68[lVar7 + 4] = (uint)(bVar22 == 0);
          *(uint *)((long)&local_48 + lVar7 * 4) = uVar27;
        }
        else {
          if (bVar34) goto LAB_0010c4de;
          pCVar13 = pCVar1;
          if (((e->state).is_cgb == FALSE) &&
             (pCVar13 = (ColorPalettes *)e->sgb_pal, (e->state).is_sgb == FALSE)) {
            RVar11 = e->color_to_rgba[0].color[0];
          }
          else {
            RVar11 = pCVar13->palettes[0].color[0];
          }
          pRVar31[lVar7 + 4] = RVar11;
          bVar34 = false;
        }
        bVar29 = bVar29 + 1;
      }
      if (((e->state).is_cgb != FALSE) && ((e->state).ppu.lcdc.bg_display == FALSE)) {
        local_68[0] = 0x1010101;
        local_68[1] = 0x1010101;
        local_68[2] = 0x1010101;
        local_68[3] = 0x1010101;
        local_68[4] = 0;
        local_68[5] = 0;
        local_68[6] = 0;
        local_68[7] = 0;
      }
      if (bVar35) {
        OVar5 = (e->state).ppu.lcdc.obj_size;
        bVar22 = "\b\x10"[OVar5];
        uVar25 = (ulong)(e->state).ppu.line_obj_count;
        while (uVar24 = uVar25, 0 < (long)uVar24) {
          uVar25 = uVar24 - 1;
          uVar3 = (e->state).ppu.line_obj[uVar24 - 1].x;
          cVar9 = uVar3 - bVar32;
          bVar10 = cVar9 + 7;
          if ((bVar10 < 0xb) &&
             (bVar15 = bVar2 - (e->state).ppu.line_obj[uVar24 - 1].y, bVar15 < bVar22)) {
            bVar30 = ~bVar15 + bVar22;
            if ((e->state).ppu.line_obj[uVar24 - 1].yflip == FALSE) {
              bVar30 = bVar15;
            }
            bVar15 = (e->state).ppu.line_obj[uVar24 - 1].tile;
            if (OVar5 == OBJ_SIZE_8X16) {
              if (bVar30 < 8) {
                bVar15 = bVar15 & 0xfe;
              }
              else {
                bVar15 = bVar15 | 1;
                bVar30 = bVar30 - 8;
              }
            }
            uVar16 = (ushort)bVar15;
            if ((e->state).is_cgb == FALSE) {
              pPVar33 = e->pal + (ulong)(e->state).ppu.line_obj[uVar24 - 1].palette + 1;
            }
            else {
              pPVar33 = (PaletteRGBA *)
                        ((long)local_38->palettes[0].color +
                        (ulong)(((e->state).ppu.line_obj[uVar24 - 1].cgb_palette & 7) << 4));
              if ((e->state).ppu.line_obj[uVar24 - 1].bank != '\0') {
                uVar16 = uVar16 + 0x200;
              }
            }
            uVar14 = (ulong)((uint)uVar16 * 0x10 + (uint)(bVar30 & 7) * 2);
            bVar15 = (e->state).vram.data[uVar14];
            bVar30 = (e->state).vram.data[uVar14 + 1];
            if ((e->state).ppu.line_obj[uVar24 - 1].xflip == FALSE) {
              bVar15 = bVar15 << 4 | bVar15 >> 4;
              bVar15 = bVar15 >> 2 & 0x33 | (bVar15 & 0x33) << 2;
              bVar15 = bVar15 >> 1 & 0x55 | (bVar15 & 0x55) * '\x02';
              bVar30 = bVar30 << 4 | bVar30 >> 4;
              bVar30 = bVar30 >> 2 & 0x33 | (bVar30 & 0x33) << 2;
              bVar30 = bVar30 >> 1 & 0x55 | (bVar30 & 0x55) * '\x02';
            }
            uVar17 = (uint)bVar10;
            if (2 < bVar10) {
              uVar17 = 3;
            }
            bVar10 = -cVar9;
            if (-1 < cVar9) {
              bVar10 = 0;
            }
            uVar26 = (uint)(bVar30 >> (bVar10 & 0x1f));
            uVar18 = (uint)(bVar15 >> (bVar10 & 0x1f));
            bVar10 = uVar3 + local_ce;
            uVar12 = (uint)bVar10;
            if ((char)bVar10 < '\x01') {
              uVar12 = 0;
            }
            for (uVar14 = (ulong)uVar12; uVar14 <= uVar17; uVar14 = uVar14 + 1) {
              uVar12 = (uVar18 & 1) + (uVar26 & 1) * 2;
              if (((uVar12 != 0) && ((local_68[uVar14 + 4] == 0 || (local_68[uVar14] != 0)))) &&
                 (((e->state).ppu.line_obj[uVar24 - 1].priority == OBJ_PRIORITY_ABOVE_BG ||
                  (local_68[uVar14] != 0)))) {
                pRVar31[uVar14] = pPVar33->color[uVar12];
              }
              uVar18 = uVar18 >> 1;
              uVar26 = uVar26 >> 1;
            }
          }
        }
      }
      local_40 = local_40 + 4;
      (e->state).ppu.mode3_render_ticks = local_40;
      pRVar31 = pRVar31 + 4;
      local_ce = local_ce + -4;
      cVar8 = cVar8 + '\x04';
      iVar6 = iVar6 + 4;
    }
    (e->state).ppu.render_x = bVar32;
  }
  return;
}

Assistant:

static void ppu_mode3_synchronize(Emulator* e) {
  u8 x = PPU.render_x;
  const u8 y = PPU.line_y;
  if (STAT.mode != PPU_MODE_MODE3 || x >= SCREEN_WIDTH) return;

  Bool display_bg = (IS_CGB || LCDC.bg_display) && !e->config.disable_bg;
  const Bool display_obj = LCDC.obj_display && !e->config.disable_obj;
  Bool rendering_window = PPU.rendering_window;
  int window_counter = rendering_window ? 0 : 255;
  if (!rendering_window && LCDC.window_display && !e->config.disable_window &&
      PPU.wx <= WINDOW_MAX_X && y >= PPU.wy) {
    window_counter = MAX(0, PPU.wx - (x + WINDOW_X_OFFSET));
  }

  const TileDataSelect data_select = LCDC.bg_tile_data_select;
  u8 mx = PPU.scx + x;
  u8 my = PPU.scy + y;
  u16 map_base = map_select_to_address(LCDC.bg_tile_map_select) |
                 ((my >> 3) * TILE_MAP_WIDTH);
  RGBA* pixel;
  if (SGB.mask != SGB_MASK_CANCEL) {
    static RGBA s_dummy_frame_buffer_line[SCREEN_WIDTH];
    pixel = s_dummy_frame_buffer_line;
  } else {
    pixel = &e->frame_buffer[y * SCREEN_WIDTH + x];
  }

  /* Cache map_addr info. */
  u16 map_addr = 0;
  PaletteRGBA* pal = NULL;
  u8 lo = 0, hi = 0;

  Bool priority = FALSE;
  int i;
  for (; PPU.mode3_render_ticks < TICKS && x < SCREEN_WIDTH;
       PPU.mode3_render_ticks += CPU_TICK, pixel += 4, x += 4) {
    Bool bg_is_zero[4] = {TRUE, TRUE, TRUE, TRUE},
         bg_priority[4] = {FALSE, FALSE, FALSE, FALSE};

    for (i = 0; i < 4; ++i, ++mx) {
      if (UNLIKELY(window_counter-- == 0)) {
        PPU.rendering_window = rendering_window = display_bg = TRUE;
        mx = x + i + WINDOW_X_OFFSET - PPU.wx;
        my = PPU.win_y;
        map_base = map_select_to_address(LCDC.window_tile_map_select) |
                   ((my >> 3) * TILE_MAP_WIDTH);
        map_addr = 0;
      }
      if (display_bg) {
        u16 new_map_addr = map_base | (mx >> 3);
        if (map_addr == new_map_addr) {
          lo <<= 1;
          hi <<= 1;
        } else {
          map_addr = new_map_addr;
          u16 tile_index = VRAM.data[map_addr];
          u8 my7 = my & 7;
          if (data_select == TILE_DATA_8800_97FF) {
            tile_index = 256 + (s8)tile_index;
          }
          if (IS_CGB) {
            u8 attr = VRAM.data[0x2000 + map_addr];
            pal = &PPU.bgcp.palettes[attr & 0x7];
            if (attr & 0x08) { tile_index += 0x200; }
            if (attr & 0x40) { my7 = 7 - my7; }
            priority = (attr & 0x80) != 0;
            u16 tile_addr = (tile_index * TILE_HEIGHT + my7) * TILE_ROW_BYTES;
            lo = VRAM.data[tile_addr];
            hi = VRAM.data[tile_addr + 1];
            if (attr & 0x20) {
              lo = reverse_bits_u8(lo);
              hi = reverse_bits_u8(hi);
            }
          } else {
            if (IS_SGB) {
              int idx = (y >> 3) * (SCREEN_WIDTH >> 3) + (x >> 3);
              u8 palidx = (SGB.attr_map[idx >> 2] >> (2 * (3 - (idx & 3)))) & 3;
              pal = &e->sgb_pal[palidx];
            } else {
              pal = &e->pal[PALETTE_TYPE_BGP];
            }
            priority = FALSE;
            u16 tile_addr = (tile_index * TILE_HEIGHT + my7) * TILE_ROW_BYTES;
            lo = VRAM.data[tile_addr];
            hi = VRAM.data[tile_addr + 1];
          }
          u8 shift = mx & 7;
          lo <<= shift;
          hi <<= shift;
        }
        u8 palette_index = ((hi >> 6) & 2) | (lo >> 7);
        pixel[i] = pal->color[palette_index];
        bg_is_zero[i] = palette_index == 0;
        bg_priority[i] = priority;
      } else {
        if (IS_CGB) {
          pixel[i] = PPU.bgcp.palettes[0].color[0];
        } else if (IS_SGB) {
          pixel[i] = e->sgb_pal[0].color[0];
        } else {
          pixel[i] = e->color_to_rgba[0].color[0];
        }
      }
    }

    /* LCDC bit 0 works differently on cgb; when it's cleared OBJ will always
     * have priority over bg and window. */
    if (IS_CGB && !LCDC.bg_display) {
      memset(&bg_is_zero, TRUE, sizeof(bg_is_zero));
      memset(&bg_priority, FALSE, sizeof(bg_priority));
    }

    if (display_obj) {
      u8 obj_height = s_obj_size_to_height[LCDC.obj_size];
      int n;
      for (n = PPU.line_obj_count - 1; n >= 0; --n) {
        Obj* o = &PPU.line_obj[n];
        /* Does [x, x + 4) intersect [o->x, o->x + 8)? Note that the sums must
         * wrap at 256 (i.e. arithmetic is 8-bit). */
        s8 ox_start = o->x - x;
        s8 ox_end = ox_start + 7; /* ox_end is inclusive. */
        u8 oy = y - o->y;
        if (((u8)ox_start >= 4 && (u8)ox_end >= 8) || oy >= obj_height) {
          continue;
        }

        if (o->yflip) {
          oy = obj_height - 1 - oy;
        }

        u16 tile_index = o->tile;
        if (obj_height == 16) {
          if (oy < 8) {
            /* Top tile of 8x16 sprite. */
            tile_index &= 0xfe;
          } else {
            /* Bottom tile of 8x16 sprite. */
            tile_index |= 0x01;
            oy -= 8;
          }
        }
        PaletteRGBA* pal = NULL;
        if (IS_CGB) {
          pal = &PPU.obcp.palettes[o->cgb_palette & 0x7];
          if (o->bank) { tile_index += 0x200; }
        } else {
          pal = &e->pal[o->palette + 1];
        }
        u16 tile_addr = (tile_index * TILE_HEIGHT + (oy & 7)) * TILE_ROW_BYTES;
        u8 lo = VRAM.data[tile_addr];
        u8 hi = VRAM.data[tile_addr + 1];
        if (!o->xflip) {
          lo = reverse_bits_u8(lo);
          hi = reverse_bits_u8(hi);
        }

        int tile_data_offset = MAX(0, -ox_start);
        assert(tile_data_offset >= 0 && tile_data_offset < 8);
        lo >>= tile_data_offset;
        hi >>= tile_data_offset;

        int start = MAX(0, ox_start);
        assert(start >= 0 && start < 4);
        int end = MIN(3, ox_end); /* end is inclusive. */
        assert(end >= 0 && end < 4);
        for (i = start; i <= end; ++i, lo >>= 1, hi >>= 1) {
          u8 palette_index = ((hi & 1) << 1) | (lo & 1);
          if (palette_index != 0 && (!bg_priority[i] || bg_is_zero[i]) &&
              (o->priority == OBJ_PRIORITY_ABOVE_BG || bg_is_zero[i])) {
            pixel[i] = pal->color[palette_index];
          }
        }
      }
    }
  }
  PPU.render_x = x;
}